

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    return 0;
  }
  uVar2 = (ulong)pWav->channels;
  uVar3 = (ulong)pWav->bitsPerSample;
  uVar5 = framesToWrite * uVar2 * uVar3;
  if (uVar5 < 8) {
    uVar5 = 0;
  }
  else {
    sVar6 = uVar5 >> 3;
    lVar4 = 0;
    do {
      sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,sVar6);
      pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
      if (sVar1 == 0) break;
      lVar4 = lVar4 + sVar1;
      pData = (void *)((long)pData + sVar1);
      sVar6 = sVar6 - sVar1;
    } while (sVar6 != 0);
    uVar3 = (ulong)pWav->bitsPerSample;
    uVar2 = (ulong)pWav->channels;
    uVar5 = lVar4 << 3;
  }
  return (uVar5 / uVar3) / uVar2;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    while (bytesToWrite > 0) {
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}